

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O2

void ecs_bulk_add_remove_type
               (ecs_world_t *world,ecs_type_t to_add,ecs_type_t to_remove,ecs_filter_t *filter)

{
  ecs_sparse_t *peVar1;
  bool condition;
  undefined8 uVar2;
  uint __line;
  ecs_world_t *peVar3;
  _Bool _Var4;
  int32_t iVar5;
  ecs_stage_t *peVar6;
  ecs_table_t *table;
  ecs_table_t *peVar7;
  long lVar8;
  int iVar9;
  char *__assertion;
  int32_t error_code;
  int dense_index;
  ecs_entities_t eVar10;
  ecs_entities_t eVar11;
  code *pcStack_a0;
  ecs_entity_t eStack_98;
  undefined1 local_90 [8];
  ecs_entities_t to_add_array;
  ecs_entities_t to_remove_array;
  undefined1 local_68 [8];
  ecs_entities_t added;
  ecs_entities_t removed;
  ecs_world_t *local_38;
  ecs_world_t *world_local;
  
  pcStack_a0 = (code *)0x12f05a;
  local_38 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0x6a);
  if (world == (ecs_world_t *)0x0) {
    __assertion = "world != ((void*)0)";
    __line = 0x6a;
  }
  else {
    pcStack_a0 = (code *)0x12f06f;
    peVar6 = ecs_get_stage(&local_38);
    dense_index = 0;
    pcStack_a0 = (code *)0x12f0a6;
    _ecs_assert(peVar6 == &local_38->stage,0x23,(char *)0x0,"stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0x6c);
    if (peVar6 == &local_38->stage) {
      pcStack_a0 = (code *)0x12f0bb;
      eVar10 = ecs_type_to_entities(to_add);
      local_90 = (undefined1  [8])eVar10.array;
      pcStack_a0 = (code *)0x12f0d4;
      to_add_array.array._0_4_ = eVar10.count;
      eVar11 = ecs_type_to_entities(to_remove);
      to_add_array._8_8_ = eVar11.array;
      iVar9 = eVar11.count;
      local_68 = (undefined1  [8])
                 ((long)&eStack_98 - ((long)(eVar10.count << 3) + 0xfU & 0xfffffffffffffff0));
      added.array._0_4_ = 0;
      lVar8 = (long)local_68 - ((long)(iVar9 << 3) + 0xfU & 0xfffffffffffffff0);
      peVar1 = (local_38->store).tables;
      added._8_8_ = lVar8;
      *(undefined8 *)(lVar8 + -8) = 0x12f133;
      iVar5 = ecs_sparse_count(peVar1);
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      do {
        if (iVar5 == dense_index) {
          return;
        }
        peVar1 = (local_38->store).tables;
        *(undefined8 *)(lVar8 + -8) = 0x12f168;
        table = (ecs_table_t *)_ecs_sparse_get(peVar1,0x80,dense_index);
        peVar3 = local_38;
        if ((table->flags & 1) == 0) {
          *(undefined8 *)(lVar8 + -8) = 0x12f185;
          _Var4 = ecs_table_match_filter(peVar3,table,filter);
          peVar3 = local_38;
          if (_Var4) {
            *(undefined8 *)(lVar8 + -8) = 0x12f1a1;
            peVar7 = ecs_table_traverse_remove
                               (peVar3,table,(ecs_entities_t *)&to_add_array.count,
                                (ecs_entities_t *)&added.count);
            peVar3 = local_38;
            *(undefined8 *)(lVar8 + -8) = 0x12f1b8;
            peVar7 = ecs_table_traverse_add
                               (peVar3,peVar7,(ecs_entities_t *)local_90,(ecs_entities_t *)local_68)
            ;
            *(undefined8 *)(lVar8 + -8) = 0xc;
            error_code = (int32_t)*(undefined8 *)(lVar8 + -8);
            *(undefined8 *)(lVar8 + -8) = 0x12f1e9;
            _ecs_assert(-1 < iVar9,error_code,(char *)0x0,"removed.count <= to_remove_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x8e);
            if (iVar9 < 0) {
              *(undefined8 *)(lVar8 + -8) = 0x12f2d1;
              __assert_fail("removed.count <= to_remove_array.count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0x8e,
                            "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                           );
            }
            condition = (int)added.array <= (int)to_add_array.array;
            *(undefined8 *)(lVar8 + -8) = 0x12f21b;
            _ecs_assert(condition,error_code,(char *)0x0,"added.count <= to_add_array.count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x8f);
            if ((int)to_add_array.array < (int)added.array) {
              *(undefined8 *)(lVar8 + -8) = 0x12f2b2;
              __assert_fail("added.count <= to_add_array.count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0x8f,
                            "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                           );
            }
            if ((table != peVar7) && ((int)added.array != 0)) {
              *(undefined8 *)(lVar8 + -8) = 0xc;
              uVar2 = *(undefined8 *)(lVar8 + -8);
              *(undefined8 *)(lVar8 + -8) = 0x12f258;
              _ecs_assert(peVar7 != (ecs_table_t *)0x0,(int32_t)uVar2,(char *)0x0,
                          "dst_table != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0x95);
              peVar3 = local_38;
              if (peVar7 == (ecs_table_t *)0x0) {
                *(undefined8 *)(lVar8 + -8) = 0x12f2f0;
                __assert_fail("dst_table != ((void*)0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                              ,0x95,
                              "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
                             );
              }
              *(undefined8 *)(lVar8 + -8) = 0x12f274;
              merge_table(peVar3,peVar7,table,(ecs_entities_t *)local_68,
                          (ecs_entities_t *)&added.count);
              added.array._0_4_ = 0;
            }
          }
        }
        dense_index = dense_index + 1;
      } while( true );
    }
    __assertion = "stage == &world->stage";
    __line = 0x6c;
  }
  pcStack_a0 = merge_table;
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,__line,
                "void ecs_bulk_add_remove_type(ecs_world_t *, ecs_type_t, ecs_type_t, const ecs_filter_t *)"
               );
}

Assistant:

void ecs_bulk_add_remove_type(
    ecs_world_t *world,
    ecs_type_t to_add,
    ecs_type_t to_remove,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_add_array = ecs_type_to_entities(to_add);
    ecs_entities_t to_remove_array = ecs_type_to_entities(to_remove);

    ecs_entities_t added = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_add_array.count),
        .count = 0
    }; 

    ecs_entities_t removed = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * to_remove_array.count),
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }

        ecs_table_t *dst_table = ecs_table_traverse_remove(
            world, table, &to_remove_array, &removed);
        
        dst_table = ecs_table_traverse_add(
            world, dst_table, &to_add_array, &added);

        ecs_assert(removed.count <= to_remove_array.count, ECS_INTERNAL_ERROR, NULL);
        ecs_assert(added.count <= to_add_array.count, ECS_INTERNAL_ERROR, NULL);

        if (table == dst_table || (!added.count && !removed.count)) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);   

        merge_table(world, dst_table, table, &added, &removed);
        added.count = 0;
        removed.count = 0;
    }    
}